

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserBase.cpp
# Opt level: O3

void __thiscall slang::parsing::ParserBase::Window::addNew(Window *this)

{
  ulong uVar1;
  Token *pTVar2;
  size_t sVar3;
  Token *pTVar4;
  undefined8 uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  Token TVar9;
  
  uVar7 = this->count;
  uVar1 = this->capacity;
  if (uVar1 <= uVar7) {
    uVar8 = this->currentOffset;
    lVar6 = uVar7 - uVar8;
    if (uVar1 >> 1 < uVar8) {
      if (uVar7 != uVar8) {
        memmove(this->buffer,this->buffer + uVar8,lVar6 * 0x10);
      }
    }
    else {
      uVar7 = uVar1 * 2;
      this->capacity = uVar7;
      pTVar4 = (Token *)operator_new__(-(ulong)(uVar7 >> 0x3c != 0) | uVar1 << 5);
      if (uVar7 != 0) {
        uVar7 = 0;
        do {
          Token::Token((Token *)((long)&pTVar4->kind + uVar7));
          uVar7 = uVar7 + 0x10;
        } while (uVar1 << 5 != uVar7);
        uVar8 = this->currentOffset;
      }
      pTVar2 = this->buffer;
      memcpy(pTVar4,pTVar2 + uVar8,lVar6 * 0x10);
      if (pTVar2 != (Token *)0x0) {
        operator_delete__(pTVar2);
      }
      this->buffer = pTVar4;
    }
    this->count = this->count - this->currentOffset;
    this->currentOffset = 0;
  }
  TVar9 = Preprocessor::next(this->tokenSource);
  uVar5 = TVar9._0_8_;
  pTVar2 = this->buffer;
  sVar3 = this->count;
  pTVar4 = pTVar2 + sVar3;
  pTVar4->kind = (short)uVar5;
  pTVar4->field_0x2 = (char)((ulong)uVar5 >> 0x10);
  pTVar4->numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  pTVar4->rawLen = (int)((ulong)uVar5 >> 0x20);
  pTVar2[sVar3].info = TVar9.info;
  this->count = this->count + 1;
  return;
}

Assistant:

void ParserBase::Window::addNew() {
    if (count >= capacity) {
        // shift tokens to the left if we are too far to the right
        size_t shift = count - currentOffset;
        if (currentOffset > (capacity >> 1)) {
            if (shift > 0)
                memmove(buffer, buffer + currentOffset, shift * sizeof(Token));
        }
        else {
            capacity *= 2;
            Token* newBuffer = new Token[capacity];
            memcpy(newBuffer, buffer + currentOffset, shift * sizeof(Token));

            delete[] buffer;
            buffer = newBuffer;
        }

        count -= currentOffset;
        currentOffset = 0;
    }

    buffer[count] = tokenSource.next();
    count++;
}